

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Expression * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::visit
          (QualifiedIdentifierResolver *this,QualifiedIdentifier *qi)

{
  Allocator *pAVar1;
  bool bVar2;
  Scope *this_00;
  Statement *statementToSearchUpTo;
  size_t sVar3;
  reference pvVar4;
  Namespace *pNVar5;
  pool_ref<soul::AST::ASTObject> *ppVar6;
  StructDeclaration *args_1;
  VariableDeclaration *args_1_00;
  NamespaceAliasDeclaration *pNVar7;
  ProcessorInstance *args_1_01;
  ProcessorAliasDeclaration *pPVar8;
  ProcessorBase *pPVar9;
  EndpointDeclaration *pEVar10;
  Context *pCVar11;
  vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
  *this_01;
  bool local_a0a;
  IdentifierPath local_780;
  CompileMessage local_728;
  IdentifierPath local_6f0;
  CompileMessage local_698;
  byte local_659;
  IdentifierPath local_658;
  IdentifierPath local_600;
  pool_ptr<soul::AST::OutputEndpointRef> local_5a8;
  pool_ptr<soul::AST::OutputEndpointRef> consoleEndpoint;
  pool_ptr<soul::AST::Constant> builtInConstant;
  __normal_iterator<soul::AST::QualifiedIdentifier::PathSection_*,_std::vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>_>
  local_590;
  const_iterator local_588;
  Namespace *local_580;
  Namespace *resolvedNamespace_1;
  CompileMessage local_520;
  pool_ptr<soul::AST::Expression> local_4e8;
  undefined1 local_4e0 [8];
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> specialisationArgs_2;
  pool_ptr<soul::AST::Namespace> local_4a0;
  pool_ptr<soul::AST::Namespace> targetNamespace_1;
  pool_ptr<soul::AST::EndpointDeclaration> local_490;
  pool_ptr<soul::AST::EndpointDeclaration> e_1;
  pool_ref<soul::AST::ASTObject> local_480;
  pool_ptr<soul::AST::ProcessorAliasDeclaration> local_478;
  pool_ptr<soul::AST::ProcessorAliasDeclaration> pa;
  pool_ptr<soul::AST::ProcessorInstance> local_468;
  pool_ptr<soul::AST::ProcessorInstance> p_1;
  CompileMessage local_408;
  pool_ptr<soul::AST::Expression> local_3d0;
  pool_ref<soul::AST::ASTObject> local_3c8;
  pool_ptr<soul::AST::NamespaceAliasDeclaration> local_3c0;
  pool_ptr<soul::AST::NamespaceAliasDeclaration> na;
  pool_ptr<soul::AST::Namespace> local_3b0;
  pool_ptr<soul::AST::Namespace> n;
  pool_ptr<soul::AST::Expression> local_3a0;
  undefined1 local_398 [8];
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> specialisationArgs_1;
  pool_ptr<soul::AST::ProcessorBase> local_358;
  pool_ptr<soul::AST::ProcessorBase> p;
  pool_ptr<soul::AST::VariableDeclaration> local_348;
  pool_ptr<soul::AST::VariableDeclaration> v;
  pool_ptr<soul::AST::Expression> local_338;
  pool_ptr<soul::AST::Expression> e;
  pool_ptr<soul::AST::StructDeclaration> local_328;
  pool_ptr<soul::AST::StructDeclaration> s;
  pool_ref<soul::AST::ASTObject> item;
  size_t itemsToRemove;
  Namespace *resolvedNamespace;
  CompileMessage local_2a8;
  pool_ptr<soul::AST::Expression> local_270;
  undefined1 local_268 [8];
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> specialisationArgs;
  pool_ptr<soul::AST::Namespace> targetNamespace;
  int itemsRemoved;
  Scope *local_1c8;
  Scope *scope;
  undefined1 local_168 [8];
  NameSearch search;
  IdentifierPath local_98;
  undefined1 local_40 [8];
  string path;
  QualifiedIdentifier *qi_local;
  QualifiedIdentifierResolver *this_local;
  
  path.field_2._8_8_ = qi;
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,qi);
  AST::QualifiedIdentifier::getPath(&local_98,(QualifiedIdentifier *)path.field_2._8_8_);
  IdentifierPath::toString_abi_cxx11_((string *)local_40,&local_98);
  IdentifierPath::~IdentifierPath(&local_98);
  AST::Scope::NameSearch::NameSearch((NameSearch *)local_168);
  AST::QualifiedIdentifier::getPath
            ((IdentifierPath *)&scope,(QualifiedIdentifier *)path.field_2._8_8_);
  IdentifierPath::operator=
            ((IdentifierPath *)(search.itemsFound.space + 7),(IdentifierPath *)&scope);
  IdentifierPath::~IdentifierPath((IdentifierPath *)&scope);
  search.partiallyQualifiedPath.pathSections.space[7]._0_1_ = 1;
  search.stopAtFirstScopeWithResults = true;
  search._177_1_ = 1;
  search._178_1_ = 0;
  search._179_1_ = 1;
  search.requiredNumFunctionArgs._0_1_ = 1;
  search.requiredNumFunctionArgs._1_1_ = this->parsingProcessorInstance == 0;
  search.requiredNumFunctionArgs._2_1_ = 1;
  this_00 = AST::ASTObject::getParentScope((ASTObject *)path.field_2._8_8_);
  local_1c8 = this_00;
  if (this_00 != (Scope *)0x0) {
    statementToSearchUpTo = pool_ptr<soul::AST::Statement>::get(&this->currentStatement);
    AST::Scope::performFullNameSearch(this_00,(NameSearch *)local_168,statementToSearchUpTo);
  }
  sVar3 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::size
                    ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)local_168)
  ;
  if (sVar3 == 0) {
    AST::QualifiedIdentifier::getPath
              ((IdentifierPath *)&stack0xfffffffffffffde0,(QualifiedIdentifier *)path.field_2._8_8_)
    ;
    bVar2 = IdentifierPath::isQualified((IdentifierPath *)&stack0xfffffffffffffde0);
    IdentifierPath::~IdentifierPath((IdentifierPath *)&stack0xfffffffffffffde0);
    if (bVar2) {
      findParameterisedNamespace
                ((QualifiedIdentifierResolver *)(specialisationArgs.space + 3),
                 (QualifiedIdentifier *)this,(int *)path.field_2._8_8_);
      bVar2 = pool_ptr<soul::AST::Namespace>::operator!=
                        ((pool_ptr<soul::AST::Namespace> *)(specialisationArgs.space + 3),
                         (void *)0x0);
      if (bVar2) {
        pvVar4 = std::
                 vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                 ::operator[]((vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                               *)(path.field_2._8_8_ + 0x30),0);
        local_270.object = (pvVar4->specialisationArgs).object;
        AST::CommaSeparatedList::getAsExpressionList
                  ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)local_268,
                   &local_270);
        pool_ptr<soul::AST::Expression>::~pool_ptr(&local_270);
        pNVar5 = pool_ptr<soul::AST::Namespace>::operator->
                           ((pool_ptr<soul::AST::Namespace> *)(specialisationArgs.space + 3));
        bVar2 = ModuleInstanceResolver::validateSpecialisationArgs
                          (&this->super_ModuleInstanceResolver,(ArgList *)local_268,
                           &(pNVar5->super_ModuleBase).specialisationParams,false);
        if (!bVar2) {
          pCVar11 = (Context *)(path.field_2._8_8_ + 0x10);
          pNVar5 = pool_ptr<soul::AST::Namespace>::operator->
                             ((pool_ptr<soul::AST::Namespace> *)(specialisationArgs.space + 3));
          (*(pNVar5->super_ModuleBase).super_ASTObject._vptr_ASTObject[0xe])(&resolvedNamespace);
          Errors::wrongNumArgsForNamespace<soul::IdentifierPath>
                    (&local_2a8,(IdentifierPath *)&resolvedNamespace);
          AST::Context::throwError(pCVar11,&local_2a8,false);
        }
        pNVar5 = pool_ptr<soul::AST::Namespace>::operator->
                           ((pool_ptr<soul::AST::Namespace> *)(specialisationArgs.space + 3));
        bVar2 = ModuleInstanceResolver::canResolveAllSpecialisationArgs
                          (&this->super_ModuleInstanceResolver,(ArgList *)local_268,
                           &(pNVar5->super_ModuleBase).specialisationParams);
        if (bVar2) {
          pNVar5 = pool_ptr<soul::AST::Namespace>::operator*
                             ((pool_ptr<soul::AST::Namespace> *)(specialisationArgs.space + 3));
          pNVar5 = ModuleInstanceResolver::getOrAddNamespaceSpecialisation
                             (&this->super_ModuleInstanceResolver,pNVar5,(ArgList *)local_268);
          updateQualifiedIdentifierPrefix(this,(QualifiedIdentifier *)path.field_2._8_8_,pNVar5);
          pvVar4 = std::
                   vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                   ::operator[]((vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                                 *)(path.field_2._8_8_ + 0x30),0);
          sVar3 = IdentifierPath::size(&pvVar4->path);
          pvVar4 = std::
                   vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                   ::operator[]((vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                                 *)(path.field_2._8_8_ + 0x30),0);
          IdentifierPath::removeFirst(&pvVar4->path,(long)(int)sVar3);
          (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
          super_RewritingASTVisitor.itemsReplaced =
               (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
               super_RewritingASTVisitor.itemsReplaced + 1;
          this_local = (QualifiedIdentifierResolver *)path.field_2._8_8_;
        }
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::~ArrayWithPreallocation
                  ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)local_268);
        if (!bVar2) goto LAB_0042e21d;
      }
      else {
LAB_0042e21d:
        bVar2 = false;
      }
      pool_ptr<soul::AST::Namespace>::~pool_ptr
                ((pool_ptr<soul::AST::Namespace> *)(specialisationArgs.space + 3));
      goto joined_r0x0042f3cb;
    }
  }
  else {
    sVar3 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::size
                      ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)
                       local_168);
    if (sVar3 != 1) goto LAB_0042f3e8;
    ppVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::front
                       ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)
                        local_168);
    s.object = (StructDeclaration *)ppVar6->object;
    bVar2 = AST::QualifiedIdentifier::isSimplePath((QualifiedIdentifier *)path.field_2._8_8_);
    if (bVar2) {
      e.object = (Expression *)s.object;
      cast<soul::AST::StructDeclaration,soul::AST::ASTObject>
                ((soul *)&local_328,(pool_ref<soul::AST::ASTObject> *)&e);
      pool_ref<soul::AST::ASTObject>::~pool_ref((pool_ref<soul::AST::ASTObject> *)&e);
      bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_328);
      if (bVar2) {
        pAVar1 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                 allocator;
        pCVar11 = (Context *)(path.field_2._8_8_ + 0x10);
        args_1 = pool_ptr<soul::AST::StructDeclaration>::operator*(&local_328);
        this_local = (QualifiedIdentifierResolver *)
                     AST::Allocator::
                     allocate<soul::AST::StructDeclarationRef,soul::AST::Context&,soul::AST::StructDeclaration&>
                               (pAVar1,pCVar11,args_1);
      }
      pool_ptr<soul::AST::StructDeclaration>::~pool_ptr(&local_328);
      if (!bVar2) {
        v.object = (VariableDeclaration *)s.object;
        cast<soul::AST::Expression,soul::AST::ASTObject>
                  ((soul *)&local_338,(pool_ref<soul::AST::ASTObject> *)&v);
        pool_ref<soul::AST::ASTObject>::~pool_ref((pool_ref<soul::AST::ASTObject> *)&v);
        bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_338);
        if (bVar2) {
          this_local = (QualifiedIdentifierResolver *)
                       pool_ptr<soul::AST::Expression>::operator*(&local_338);
        }
        pool_ptr<soul::AST::Expression>::~pool_ptr(&local_338);
        if (!bVar2) {
          p.object = (ProcessorBase *)s.object;
          cast<soul::AST::VariableDeclaration,soul::AST::ASTObject>
                    ((soul *)&local_348,(pool_ref<soul::AST::ASTObject> *)&p);
          pool_ref<soul::AST::ASTObject>::~pool_ref((pool_ref<soul::AST::ASTObject> *)&p);
          bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_348);
          if (bVar2) {
            this->numVariablesResolved = this->numVariablesResolved + 1;
            pAVar1 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                     allocator;
            pCVar11 = (Context *)(path.field_2._8_8_ + 0x10);
            args_1_00 = pool_ptr<soul::AST::VariableDeclaration>::operator*(&local_348);
            this_local = (QualifiedIdentifierResolver *)
                         AST::Allocator::
                         allocate<soul::AST::VariableRef,soul::AST::Context&,soul::AST::VariableDeclaration&>
                                   (pAVar1,pCVar11,args_1_00);
          }
          pool_ptr<soul::AST::VariableDeclaration>::~pool_ptr(&local_348);
          if (bVar2) goto LAB_0042f3b7;
          specialisationArgs_1.space[3] = (uint64_t)s.object;
          cast<soul::AST::ProcessorBase,soul::AST::ASTObject>
                    ((soul *)&local_358,
                     (pool_ref<soul::AST::ASTObject> *)(specialisationArgs_1.space + 3));
          pool_ref<soul::AST::ASTObject>::~pool_ref
                    ((pool_ref<soul::AST::ASTObject> *)(specialisationArgs_1.space + 3));
          bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_358);
          if (bVar2) {
            bVar2 = pool_ptr<soul::AST::Connection::SharedEndpoint>::operator!=
                              (&this->currentConnectionEndpoint,(void *)0x0);
            if (bVar2) {
              pvVar4 = std::
                       vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                       ::operator[]((vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                                     *)(path.field_2._8_8_ + 0x30),0);
              local_3a0.object = (pvVar4->specialisationArgs).object;
              AST::CommaSeparatedList::getAsExpressionList
                        ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                         local_398,&local_3a0);
              pool_ptr<soul::AST::Expression>::~pool_ptr(&local_3a0);
              pPVar9 = pool_ptr<soul::AST::ProcessorBase>::operator->(&local_358);
              bVar2 = ModuleInstanceResolver::validateSpecialisationArgs
                                (&this->super_ModuleInstanceResolver,(ArgList *)local_398,
                                 &(pPVar9->super_ModuleBase).specialisationParams,false);
              if (bVar2) {
                pCVar11 = (Context *)(path.field_2._8_8_ + 0x10);
                pPVar9 = pool_ptr<soul::AST::ProcessorBase>::operator*(&local_358);
                pool_ptr<soul::AST::Expression>::pool_ptr((pool_ptr<soul::AST::Expression> *)&n);
                this_local = (QualifiedIdentifierResolver *)
                             getOrCreateImplicitProcessorInstance
                                       (this,pCVar11,pPVar9,(pool_ptr<soul::AST::Expression> *)&n);
                pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)&n);
              }
              else {
                this_local = (QualifiedIdentifierResolver *)path.field_2._8_8_;
              }
              bVar2 = true;
              ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::
              ~ArrayWithPreallocation
                        ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                         local_398);
            }
            else {
              pAVar1 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                       allocator;
              pCVar11 = (Context *)(path.field_2._8_8_ + 0x10);
              pPVar9 = pool_ptr<soul::AST::ProcessorBase>::operator*(&local_358);
              this_local = (QualifiedIdentifierResolver *)
                           AST::Allocator::
                           allocate<soul::AST::ProcessorRef,soul::AST::Context&,soul::AST::ProcessorBase&>
                                     (pAVar1,pCVar11,pPVar9);
              bVar2 = true;
            }
          }
          else {
            bVar2 = false;
          }
          pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&local_358);
          if (bVar2 != false) goto LAB_0042f3b7;
          na.object = (NamespaceAliasDeclaration *)s.object;
          cast<soul::AST::Namespace,soul::AST::ASTObject>
                    ((soul *)&local_3b0,(pool_ref<soul::AST::ASTObject> *)&na);
          pool_ref<soul::AST::ASTObject>::~pool_ref((pool_ref<soul::AST::ASTObject> *)&na);
          bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_3b0);
          if (bVar2) {
            pAVar1 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                     allocator;
            pCVar11 = (Context *)(path.field_2._8_8_ + 0x10);
            pNVar5 = pool_ptr<soul::AST::Namespace>::operator*(&local_3b0);
            this_local = (QualifiedIdentifierResolver *)
                         AST::Allocator::
                         allocate<soul::AST::NamespaceRef,soul::AST::Context&,soul::AST::Namespace&>
                                   (pAVar1,pCVar11,pNVar5);
          }
          pool_ptr<soul::AST::Namespace>::~pool_ptr(&local_3b0);
          if (bVar2) goto LAB_0042f3b7;
          local_3c8.object = (ASTObject *)s.object;
          cast<soul::AST::NamespaceAliasDeclaration,soul::AST::ASTObject>
                    ((soul *)&local_3c0,&local_3c8);
          pool_ref<soul::AST::ASTObject>::~pool_ref(&local_3c8);
          bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_3c0);
          if (bVar2) {
            pNVar7 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->(&local_3c0);
            bVar2 = AST::NamespaceAliasDeclaration::isResolved(pNVar7);
            if (!bVar2) {
              pNVar7 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->(&local_3c0);
              local_3d0.object = (pNVar7->targetNamespace).object;
              bVar2 = soul::operator==(&local_3d0,(QualifiedIdentifier *)path.field_2._8_8_);
              pool_ptr<soul::AST::Expression>::~pool_ptr(&local_3d0);
              if (bVar2) {
                pCVar11 = (Context *)(path.field_2._8_8_ + 0x10);
                AST::QualifiedIdentifier::getPath
                          ((IdentifierPath *)&p_1,(QualifiedIdentifier *)path.field_2._8_8_);
                Errors::circularNamespaceAlias<soul::IdentifierPath>
                          (&local_408,(IdentifierPath *)&p_1);
                AST::Context::throwError(pCVar11,&local_408,false);
              }
              goto LAB_0042eb60;
            }
            pAVar1 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                     allocator;
            pCVar11 = (Context *)(path.field_2._8_8_ + 0x10);
            pNVar7 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->(&local_3c0);
            pNVar5 = pool_ptr<soul::AST::Namespace>::operator*(&pNVar7->resolvedNamespace);
            this_local = (QualifiedIdentifierResolver *)
                         AST::Allocator::
                         allocate<soul::AST::NamespaceRef,soul::AST::Context&,soul::AST::Namespace&>
                                   (pAVar1,pCVar11,pNVar5);
            bVar2 = true;
          }
          else {
LAB_0042eb60:
            bVar2 = false;
          }
          pool_ptr<soul::AST::NamespaceAliasDeclaration>::~pool_ptr(&local_3c0);
          if (bVar2 != false) goto LAB_0042f3b7;
          pa.object = (ProcessorAliasDeclaration *)s.object;
          cast<soul::AST::ProcessorInstance,soul::AST::ASTObject>
                    ((soul *)&local_468,(pool_ref<soul::AST::ASTObject> *)&pa);
          pool_ref<soul::AST::ASTObject>::~pool_ref((pool_ref<soul::AST::ASTObject> *)&pa);
          bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_468);
          if (bVar2) {
            pAVar1 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                     allocator;
            pCVar11 = (Context *)(path.field_2._8_8_ + 0x10);
            args_1_01 = pool_ptr<soul::AST::ProcessorInstance>::operator*(&local_468);
            this_local = (QualifiedIdentifierResolver *)
                         AST::Allocator::
                         allocate<soul::AST::ProcessorInstanceRef,soul::AST::Context&,soul::AST::ProcessorInstance&>
                                   (pAVar1,pCVar11,args_1_01);
          }
          pool_ptr<soul::AST::ProcessorInstance>::~pool_ptr(&local_468);
          if (bVar2) goto LAB_0042f3b7;
          local_480.object = (ASTObject *)s.object;
          cast<soul::AST::ProcessorAliasDeclaration,soul::AST::ASTObject>
                    ((soul *)&local_478,&local_480);
          pool_ref<soul::AST::ASTObject>::~pool_ref(&local_480);
          bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_478);
          if (bVar2) {
            pPVar8 = pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->(&local_478);
            bVar2 = AST::ProcessorAliasDeclaration::isResolved(pPVar8);
            if (!bVar2) goto LAB_0042eeb3;
            bVar2 = pool_ptr<soul::AST::Connection::SharedEndpoint>::operator!=
                              (&this->currentConnectionEndpoint,(void *)0x0);
            if (bVar2) {
              pCVar11 = (Context *)(path.field_2._8_8_ + 0x10);
              pPVar8 = pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->(&local_478);
              pPVar9 = pool_ptr<soul::AST::ProcessorBase>::operator*(&pPVar8->resolvedProcessor);
              pool_ptr<soul::AST::Expression>::pool_ptr((pool_ptr<soul::AST::Expression> *)&e_1);
              this_local = (QualifiedIdentifierResolver *)
                           getOrCreateImplicitProcessorInstance
                                     (this,pCVar11,pPVar9,(pool_ptr<soul::AST::Expression> *)&e_1);
              pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)&e_1);
              bVar2 = true;
            }
            else {
              pAVar1 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                       allocator;
              pCVar11 = (Context *)(path.field_2._8_8_ + 0x10);
              pPVar8 = pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->(&local_478);
              pPVar9 = pool_ptr<soul::AST::ProcessorBase>::operator*(&pPVar8->resolvedProcessor);
              this_local = (QualifiedIdentifierResolver *)
                           AST::Allocator::
                           allocate<soul::AST::ProcessorRef,soul::AST::Context&,soul::AST::ProcessorBase&>
                                     (pAVar1,pCVar11,pPVar9);
              bVar2 = true;
            }
          }
          else {
LAB_0042eeb3:
            bVar2 = false;
          }
          pool_ptr<soul::AST::ProcessorAliasDeclaration>::~pool_ptr(&local_478);
          if (bVar2 != false) goto LAB_0042f3b7;
          targetNamespace_1.object = (Namespace *)s.object;
          cast<soul::AST::EndpointDeclaration,soul::AST::ASTObject>
                    ((soul *)&local_490,(pool_ref<soul::AST::ASTObject> *)&targetNamespace_1);
          pool_ref<soul::AST::ASTObject>::~pool_ref
                    ((pool_ref<soul::AST::ASTObject> *)&targetNamespace_1);
          bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_490);
          if (bVar2) {
            pEVar10 = pool_ptr<soul::AST::EndpointDeclaration>::operator->(&local_490);
            bVar2 = AST::EndpointDeclaration::isUnresolvedChildReference(pEVar10);
            if (bVar2) goto LAB_0042f01f;
            pAVar1 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                     allocator;
            pCVar11 = (Context *)(path.field_2._8_8_ + 0x10);
            pEVar10 = pool_ptr<soul::AST::EndpointDeclaration>::operator*(&local_490);
            this_local = (QualifiedIdentifierResolver *)
                         ASTUtilities::createEndpointRef(pAVar1,pCVar11,pEVar10);
            bVar2 = true;
          }
          else {
LAB_0042f01f:
            bVar2 = false;
          }
          pool_ptr<soul::AST::EndpointDeclaration>::~pool_ptr(&local_490);
          if (bVar2 != false) goto LAB_0042f3b7;
          goto LAB_0042f3ad;
        }
      }
    }
    else {
      specialisationArgs_2.space[3] = (uint64_t)s.object;
      cast<soul::AST::Namespace,soul::AST::ASTObject>
                ((soul *)&local_4a0,
                 (pool_ref<soul::AST::ASTObject> *)(specialisationArgs_2.space + 3));
      pool_ref<soul::AST::ASTObject>::~pool_ref
                ((pool_ref<soul::AST::ASTObject> *)(specialisationArgs_2.space + 3));
      bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_4a0);
      if (bVar2) {
        pvVar4 = std::
                 vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                 ::operator[]((vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                               *)(path.field_2._8_8_ + 0x30),0);
        local_4e8.object = (pvVar4->specialisationArgs).object;
        AST::CommaSeparatedList::getAsExpressionList
                  ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)local_4e0,
                   &local_4e8);
        pool_ptr<soul::AST::Expression>::~pool_ptr(&local_4e8);
        pNVar5 = pool_ptr<soul::AST::Namespace>::operator->(&local_4a0);
        bVar2 = ModuleInstanceResolver::validateSpecialisationArgs
                          (&this->super_ModuleInstanceResolver,(ArgList *)local_4e0,
                           &(pNVar5->super_ModuleBase).specialisationParams,false);
        if (!bVar2) {
          pCVar11 = (Context *)(path.field_2._8_8_ + 0x10);
          pNVar5 = pool_ptr<soul::AST::Namespace>::operator->(&local_4a0);
          (*(pNVar5->super_ModuleBase).super_ASTObject._vptr_ASTObject[0xe])(&resolvedNamespace_1);
          Errors::wrongNumArgsForNamespace<soul::IdentifierPath>
                    (&local_520,(IdentifierPath *)&resolvedNamespace_1);
          AST::Context::throwError(pCVar11,&local_520,false);
        }
        pNVar5 = pool_ptr<soul::AST::Namespace>::operator->(&local_4a0);
        bVar2 = ModuleInstanceResolver::canResolveAllSpecialisationArgs
                          (&this->super_ModuleInstanceResolver,(ArgList *)local_4e0,
                           &(pNVar5->super_ModuleBase).specialisationParams);
        if (bVar2) {
          pNVar5 = pool_ptr<soul::AST::Namespace>::operator*(&local_4a0);
          local_580 = ModuleInstanceResolver::getOrAddNamespaceSpecialisation
                                (&this->super_ModuleInstanceResolver,pNVar5,(ArgList *)local_4e0);
          updateQualifiedIdentifierPrefix(this,(QualifiedIdentifier *)path.field_2._8_8_,local_580);
          this_01 = (vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                     *)(path.field_2._8_8_ + 0x30);
          local_590._M_current =
               (PathSection *)
               std::
               vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ::begin(this_01);
          __gnu_cxx::
          __normal_iterator<soul::AST::QualifiedIdentifier::PathSection_const*,std::vector<soul::AST::QualifiedIdentifier::PathSection,std::allocator<soul::AST::QualifiedIdentifier::PathSection>>>
          ::__normal_iterator<soul::AST::QualifiedIdentifier::PathSection*>
                    ((__normal_iterator<soul::AST::QualifiedIdentifier::PathSection_const*,std::vector<soul::AST::QualifiedIdentifier::PathSection,std::allocator<soul::AST::QualifiedIdentifier::PathSection>>>
                      *)&local_588,&local_590);
          std::
          vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
          ::erase(this_01,local_588);
          (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
          super_RewritingASTVisitor.itemsReplaced =
               (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
               super_RewritingASTVisitor.itemsReplaced + 1;
          this_local = (QualifiedIdentifierResolver *)path.field_2._8_8_;
        }
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::~ArrayWithPreallocation
                  ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)local_4e0);
        if (!bVar2) goto LAB_0042f37b;
      }
      else {
LAB_0042f37b:
        bVar2 = false;
      }
      pool_ptr<soul::AST::Namespace>::~pool_ptr(&local_4a0);
      if (bVar2 == false) {
LAB_0042f3ad:
        bVar2 = false;
      }
    }
LAB_0042f3b7:
    pool_ref<soul::AST::ASTObject>::~pool_ref((pool_ref<soul::AST::ASTObject> *)&s);
joined_r0x0042f3cb:
    if (bVar2 != false) goto LAB_0042f7c1;
  }
LAB_0042f3e8:
  getBuiltInConstant((QualifiedIdentifierResolver *)&consoleEndpoint,(QualifiedIdentifier *)this);
  bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&consoleEndpoint);
  if (bVar2) {
    this_local = (QualifiedIdentifierResolver *)
                 pool_ptr<soul::AST::Constant>::operator*
                           ((pool_ptr<soul::AST::Constant> *)&consoleEndpoint);
  }
  pool_ptr<soul::AST::Constant>::~pool_ptr((pool_ptr<soul::AST::Constant> *)&consoleEndpoint);
  if (!bVar2) {
    ASTUtilities::createConsoleEndpoint
              ((ASTUtilities *)&local_5a8,
               (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.allocator
               ,(QualifiedIdentifier *)path.field_2._8_8_);
    bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_5a8);
    if (bVar2) {
      this_local = (QualifiedIdentifierResolver *)
                   pool_ptr<soul::AST::OutputEndpointRef>::operator*(&local_5a8);
    }
    pool_ptr<soul::AST::OutputEndpointRef>::~pool_ptr(&local_5a8);
    if (!bVar2) {
      if (((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.ignoreErrors
          & 1U) == 0) {
        local_659 = 0;
        AST::QualifiedIdentifier::getPath(&local_600,(QualifiedIdentifier *)path.field_2._8_8_);
        bVar2 = IdentifierPath::isUnqualifiedName(&local_600,"wrap");
        local_a0a = true;
        if (!bVar2) {
          AST::QualifiedIdentifier::getPath(&local_658,(QualifiedIdentifier *)path.field_2._8_8_);
          local_659 = 1;
          local_a0a = IdentifierPath::isUnqualifiedName(&local_658,"clamp");
        }
        if ((local_659 & 1) != 0) {
          IdentifierPath::~IdentifierPath(&local_658);
        }
        IdentifierPath::~IdentifierPath(&local_600);
        if (local_a0a == false) {
          sVar3 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::size
                            ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)
                             local_168);
          if (1 < sVar3) {
            pCVar11 = (Context *)(path.field_2._8_8_ + 0x10);
            AST::QualifiedIdentifier::getPath(&local_6f0,(QualifiedIdentifier *)path.field_2._8_8_);
            Errors::ambiguousSymbol<soul::IdentifierPath>(&local_698,&local_6f0);
            AST::Context::throwError(pCVar11,&local_698,false);
          }
          pCVar11 = (Context *)(path.field_2._8_8_ + 0x10);
          AST::QualifiedIdentifier::getPath(&local_780,(QualifiedIdentifier *)path.field_2._8_8_);
          Errors::unresolvedSymbol<soul::IdentifierPath>(&local_728,&local_780);
          AST::Context::throwError(pCVar11,&local_728,false);
        }
        this_local = (QualifiedIdentifierResolver *)path.field_2._8_8_;
      }
      else {
        (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails =
             (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails +
             1;
        this_local = (QualifiedIdentifierResolver *)path.field_2._8_8_;
      }
    }
  }
LAB_0042f7c1:
  AST::Scope::NameSearch::~NameSearch((NameSearch *)local_168);
  std::__cxx11::string::~string((string *)local_40);
  return (Expression *)this_local;
}

Assistant:

AST::Expression& visit (AST::QualifiedIdentifier& qi) override
        {
            super::visit (qi);

            auto path = qi.getPath().toString();

            AST::Scope::NameSearch search;
            search.partiallyQualifiedPath = qi.getPath();
            search.stopAtFirstScopeWithResults = true;
            search.findVariables = true;
            search.findTypes = true;
            search.findFunctions = false;
            search.findNamespaces = true;
            search.findProcessors = true;
            search.findProcessorInstances = (parsingProcessorInstance == 0);
            search.findEndpoints = true;

            if (auto scope = qi.getParentScope())
                scope->performFullNameSearch (search, currentStatement.get());

            if (search.itemsFound.size() == 0)
            {
                if (qi.getPath().isQualified())
                {
                    int itemsRemoved = 0;
                    auto targetNamespace = findParameterisedNamespace (qi, itemsRemoved);

                    if (targetNamespace != nullptr)
                    {
                        auto specialisationArgs = AST::CommaSeparatedList::getAsExpressionList (qi.pathSections[0].specialisationArgs);

                        if (! validateSpecialisationArgs (specialisationArgs, targetNamespace->specialisationParams, false))
                            qi.context.throwError (Errors::wrongNumArgsForNamespace (targetNamespace->getFullyQualifiedDisplayPath()));

                        if (canResolveAllSpecialisationArgs (specialisationArgs, targetNamespace->specialisationParams))
                        {
                            auto& resolvedNamespace = getOrAddNamespaceSpecialisation (*targetNamespace, specialisationArgs);
                            updateQualifiedIdentifierPrefix (qi, resolvedNamespace);
                            auto itemsToRemove = static_cast<size_t> (static_cast<int> (qi.pathSections[0].path.size()) - itemsRemoved);
                            qi.pathSections[0].path.removeFirst (itemsToRemove);
                            ++itemsReplaced;
                            return qi;
                        }
                    }
                }
            }
            else if (search.itemsFound.size() == 1)
            {
                auto item = search.itemsFound.front();

                if (qi.isSimplePath())
                {
                    if (auto s = cast<AST::StructDeclaration> (item))
                        return allocator.allocate<AST::StructDeclarationRef> (qi.context, *s);

                    if (auto e = cast<AST::Expression> (item))
                        return *e;

                    if (auto v = cast<AST::VariableDeclaration> (item))
                    {
                        ++numVariablesResolved;
                        return allocator.allocate<AST::VariableRef> (qi.context, *v);
                    }

                    if (auto p = cast<AST::ProcessorBase> (item))
                    {
                        if (currentConnectionEndpoint != nullptr)
                        {
                            auto specialisationArgs = AST::CommaSeparatedList::getAsExpressionList (qi.pathSections[0].specialisationArgs);

                            if (! validateSpecialisationArgs (specialisationArgs, p->specialisationParams, false))
                                return qi;

                            return getOrCreateImplicitProcessorInstance (qi.context, *p, {});
                        }

                        return allocator.allocate<AST::ProcessorRef> (qi.context, *p);
                    }

                    if (auto n = cast<AST::Namespace> (item))
                        return allocator.allocate<AST::NamespaceRef> (qi.context, *n);

                    if (auto na = cast<AST::NamespaceAliasDeclaration> (item))
                    {
                        if (na->isResolved())
                            return allocator.allocate<AST::NamespaceRef> (qi.context, *na->resolvedNamespace);

                        if (na->targetNamespace == &qi)
                            qi.context.throwError (Errors::circularNamespaceAlias (qi.getPath()));
                    }

                    if (auto p = cast<AST::ProcessorInstance> (item))
                        return allocator.allocate<AST::ProcessorInstanceRef> (qi.context, *p);

                    if (auto pa = cast<AST::ProcessorAliasDeclaration> (item))
                    {
                        if (pa->isResolved())
                        {
                            if (currentConnectionEndpoint != nullptr)
                                return getOrCreateImplicitProcessorInstance (qi.context, *pa->resolvedProcessor, {});

                            return allocator.allocate<AST::ProcessorRef> (qi.context, *pa->resolvedProcessor);
                        }
                    }

                    if (auto e = cast<AST::EndpointDeclaration> (item))
                        if (! e->isUnresolvedChildReference())
                            return ASTUtilities::createEndpointRef (allocator, qi.context, *e);
                }
                else
                {
                    if (auto targetNamespace = cast<AST::Namespace> (item))
                    {
                        auto specialisationArgs = AST::CommaSeparatedList::getAsExpressionList (qi.pathSections[0].specialisationArgs);

                        if (! validateSpecialisationArgs (specialisationArgs, targetNamespace->specialisationParams, false))
                            qi.context.throwError (Errors::wrongNumArgsForNamespace (targetNamespace->getFullyQualifiedDisplayPath()));

                        if (canResolveAllSpecialisationArgs (specialisationArgs, targetNamespace->specialisationParams))
                        {
                            auto& resolvedNamespace = getOrAddNamespaceSpecialisation (*targetNamespace, specialisationArgs);
                            updateQualifiedIdentifierPrefix (qi, resolvedNamespace);

                            qi.pathSections.erase (qi.pathSections.begin());
                            ++itemsReplaced;
                            return qi;
                        }

                    }
                }
            }


            if (auto builtInConstant = getBuiltInConstant (qi))
                return *builtInConstant;

            if (auto consoleEndpoint = ASTUtilities::createConsoleEndpoint (allocator, qi))
                return *consoleEndpoint;

            if (ignoreErrors)
            {
                ++numFails;
            }
            else
            {
                if (qi.getPath().isUnqualifiedName ("wrap") || qi.getPath().isUnqualifiedName ("clamp"))
                    return qi;

                if (search.itemsFound.size() > 1)
                    qi.context.throwError (Errors::ambiguousSymbol (qi.getPath()));

                qi.context.throwError (Errors::unresolvedSymbol (qi.getPath()));
            }

            return qi;
        }